

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

double __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
empirical_cost(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
               *this)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  undefined1 extraout_var [56];
  
  iVar1 = this->num_inserts_;
  iVar2 = this->num_lookups_ + iVar1;
  if (iVar2 != 0) {
    auVar3._0_8_ = exp_search_iterations_per_operation(this);
    auVar3._8_56_ = extraout_var;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (double)((ulong)(this->num_inserts_ != 0) *
                           (long)(((double)this->num_shifts_ / (double)this->num_inserts_) * 0.5)) *
                   ((double)iVar1 / (double)iVar2);
    auVar4 = vfmadd132sd_fma(auVar3._0_16_,auVar4,ZEXT816(0x4034000000000000));
    return auVar4._0_8_;
  }
  return 0.0;
}

Assistant:

double empirical_cost() const {
    if (num_inserts_ + num_lookups_ == 0) {
      return 0;
    }
    double frac_inserts =
        static_cast<double>(num_inserts_) / (num_inserts_ + num_lookups_);
    return kExpSearchIterationsWeight * exp_search_iterations_per_operation() +
           kShiftsWeight * shifts_per_insert() * frac_inserts;
  }